

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

int32 vector_mean(float32 *mean,float32 **data,int32 n_vec,int32 n_dim)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((0 < n_vec) && (0 < n_dim)) {
    uVar4 = (ulong)(uint)n_dim;
    uVar3 = 0;
    memset(mean,0,uVar4 * 4);
    do {
      pfVar1 = data[uVar3];
      uVar2 = 0;
      do {
        mean[uVar2] = (float32)((float)pfVar1[uVar2] + (float)mean[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n_vec);
    uVar3 = 0;
    do {
      mean[uVar3] = (float32)((float)mean[uVar3] * (1.0 / (float)n_vec));
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    return 0;
  }
  __assert_fail("(n_vec > 0) && (n_dim > 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x129,"int32 vector_mean(float32 *, float32 **, int32, int32)");
}

Assistant:

int32
vector_mean(float32 * mean, float32 ** data, int32 n_vec, int32 n_dim)
{
    int32 i, j;
    float64 f;

    assert((n_vec > 0) && (n_dim > 0));

    for (i = 0; i < n_dim; i++)
        mean[i] = 0.0;

    for (i = 0; i < n_vec; i++) {
        for (j = 0; j < n_dim; j++)
            mean[j] += data[i][j];
    }

    f = 1.0 / (float64) n_vec;
    for (i = 0; i < n_dim; i++)
        mean[i] *= (float32) f;

    return 0;
}